

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::add_sample
          (TypedTimeSamples<std::array<float,_4UL>_> *this,double t,array<float,_4UL> *v)

{
  undefined1 local_40 [8];
  Sample s;
  array<float,_4UL> *v_local;
  double t_local;
  TypedTimeSamples<std::array<float,_4UL>_> *this_local;
  
  s._24_8_ = v;
  Sample::Sample((Sample *)local_40);
  s.t = *(double *)s._24_8_;
  s.value._M_elems._0_8_ = *(undefined8 *)(s._24_8_ + 8);
  local_40 = (undefined1  [8])t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample>>
              *)this,(Sample *)local_40);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }